

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  int s;
  LRUCache *in_stack_00000020;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    LRUCache::Prune(in_stack_00000020);
  }
  return;
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }